

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  data config;
  undefined1 local_19;
  
  local_19 = 1;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib552.c"
                  ,0xb2,iVar2,uVar3);
  }
  if (iVar2 == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib552.c"
                   );
      iVar2 = 0x7c;
    }
    else {
      iVar2 = curl_easy_setopt(lVar4,0x4e7e,my_trace);
      if (((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar4,0x276f,&local_19), iVar2 == 0)) &&
         (iVar2 = curl_easy_setopt(lVar4,0x29,1), iVar2 == 0)) {
        uVar5 = 0;
        do {
          databuf[uVar5] = "test data"[uVar5 + (uVar5 / 5 & 0xfffffffffffffffe) * -5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 70000);
        iVar2 = curl_easy_setopt(lVar4,0x2f,1);
        if (((((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar4,0x3c,70000), iVar2 == 0)) &&
             ((iVar2 = curl_easy_setopt(lVar4,0x4e2c,read_callback), iVar2 == 0 &&
              ((iVar2 = curl_easy_setopt(lVar4,0x4e2b,write_callback), iVar2 == 0 &&
               (iVar2 = curl_easy_setopt(lVar4,0x4ea2,ioctl_callback), iVar2 == 0)))))) &&
            (iVar2 = curl_easy_setopt(lVar4,0x2714,libtest_arg2), iVar2 == 0)) &&
           ((iVar2 = curl_easy_setopt(lVar4,0x2712,URL), iVar2 == 0 &&
            (iVar2 = curl_easy_setopt(lVar4,0x6f,0xffffffffffffffef), iVar2 == 0)))) {
          iVar2 = curl_easy_perform(lVar4);
          curl_mfprintf(_stderr,"curl_easy_perform = %d\n",iVar2);
        }
      }
    }
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  struct data config;
  size_t i;
  static const char fill[] = "test data";

  config.trace_ascii = 1; /* enable ascii tracing */

  global_init(CURL_GLOBAL_ALL);
  easy_init(curl);

  test_setopt(curl, CURLOPT_DEBUGFUNCTION, my_trace);
  test_setopt(curl, CURLOPT_DEBUGDATA, &config);
  /* the DEBUGFUNCTION has no effect until we enable VERBOSE */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* setup repeated data string */
  for(i = 0; i < sizeof(databuf); ++i)
      databuf[i] = fill[i % sizeof fill];

  /* Post */
  test_setopt(curl, CURLOPT_POST, 1L);

#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif

  /* Setup read callback */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long) sizeof(databuf));
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* Write callback */
  test_setopt(curl, CURLOPT_WRITEFUNCTION, write_callback);

  /* Ioctl function */
  test_setopt(curl, CURLOPT_IOCTLFUNCTION, ioctl_callback);

  test_setopt(curl, CURLOPT_PROXY, libtest_arg2);

  test_setopt(curl, CURLOPT_URL, URL);

  /* Accept any auth. But for this bug configure proxy with DIGEST, basic
     might work too, not NTLM */
  test_setopt(curl, CURLOPT_PROXYAUTH, (long)CURLAUTH_ANY);

  res = curl_easy_perform(curl);
  fprintf(stderr, "curl_easy_perform = %d\n", (int)res);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return (int)res;
}